

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QRectF * __thiscall
QTextDocumentLayoutPrivate::frameBoundingRectInternal
          (QTextDocumentLayoutPrivate *this,QTextFrame *frame)

{
  bool bVar1;
  int iVar2;
  QTextTableData *in_RDX;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  QTextTable *table;
  QTextFrameData *fd;
  QTextFrame *f;
  int framePos;
  QPointF pos;
  QTextTableCell cell;
  QTextFrame *in_stack_ffffffffffffff58;
  QRectF *atopLeft;
  QRectF *in_stack_ffffffffffffff70;
  QTextFrameData *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  QTextTableData *this_00;
  undefined1 in_stack_ffffffffffffffa0 [16];
  QPointF local_48;
  QPointF local_38;
  QPointF local_28;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  atopLeft = in_RDI;
  QPointF::QPointF(&local_28);
  iVar2 = QTextFrame::firstPosition(in_stack_ffffffffffffff58);
  this_00 = in_RDX;
  while (in_RDX != (QTextTableData *)0x0) {
    in_stack_ffffffffffffff78 = ::data((QTextFrame *)in_RDI);
    local_38 = QFixedPoint::toPointF((QFixedPoint *)in_stack_ffffffffffffff78);
    QPointF::operator+=(&local_28,&local_38);
    in_stack_ffffffffffffff70 = (QRectF *)qobject_cast<QTextTable*>((QObject *)0x800934);
    if (in_stack_ffffffffffffff70 != (QRectF *)0x0) {
      local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTable::cellAt(in_stack_ffffffffffffffa0._8_8_,in_stack_ffffffffffffffa0._4_4_);
      bVar1 = QTextTableCell::isValid((QTextTableCell *)local_18);
      if (bVar1) {
        QTextTableData::cellPosition
                  (this_00,(QTextTable *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                   (QTextTableCell *)in_RDX);
        local_48 = QFixedPoint::toPointF((QFixedPoint *)in_stack_ffffffffffffff78);
        QPointF::operator+=(&local_28,&local_48);
      }
      QTextTableCell::~QTextTableCell((QTextTableCell *)local_18);
    }
    in_RDX = (QTextTableData *)QTextFrame::parentFrame((QTextFrame *)in_RDI);
  }
  ::data((QTextFrame *)in_RDI);
  QFixedSize::toSizeF((QFixedSize *)in_stack_ffffffffffffff78);
  QRectF::QRectF(in_stack_ffffffffffffff70,(QPointF *)atopLeft,(QSizeF *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return atopLeft;
}

Assistant:

QRectF QTextDocumentLayoutPrivate::frameBoundingRectInternal(QTextFrame *frame) const
{
    QPointF pos;
    const int framePos = frame->firstPosition();
    QTextFrame *f = frame;
    while (f) {
        QTextFrameData *fd = data(f);
        pos += fd->position.toPointF();

        if (QTextTable *table = qobject_cast<QTextTable *>(f)) {
            QTextTableCell cell = table->cellAt(framePos);
            if (cell.isValid())
                pos += static_cast<QTextTableData *>(fd)->cellPosition(table, cell).toPointF();
        }

        f = f->parentFrame();
    }
    return QRectF(pos, data(frame)->size.toSizeF());
}